

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_spi_write(uint16_t data)

{
  uint32_t *paddr;
  
  paddr = bcm2835_spi0;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr,0x80,0x80);
  do {
    while (debug != '\0') {
      printf("bcm2835_peri_read  paddr %p\n");
    }
  } while ((*paddr >> 0x12 & 1) == 0);
  paddr[1] = (uint)(data >> 8);
  if (debug == '\0') {
    paddr[1] = data & 0xff;
  }
  else {
    printf("bcm2835_peri_write_nb paddr %p, value %08X\n");
  }
  do {
    while (debug != '\0') {
      printf("bcm2835_peri_read_nb  paddr %p\n");
    }
  } while ((*paddr >> 0x10 & 1) == 0);
  bcm2835_peri_set_bits(paddr,0,0x80);
  return;
}

Assistant:

void bcm2835_spi_write(uint16_t data)
{
#if 0
	char buf[2];

	buf[0] = data >> 8;
	buf[1] = data & 0xFF;

	bcm2835_spi_transfern(buf, 2);
#else
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

	/* Maybe wait for TXD */
	while (!(bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))
	    ;

	/* Write to FIFO */
	bcm2835_peri_write_nb(fifo,  (uint32_t) data >> 8);
	bcm2835_peri_write_nb(fifo,  data & 0xFF);


    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
#endif
}